

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonpath::detail::
jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::jsonpath_evaluator
          (jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,allocator_type *alloc)

{
  ser_context *in_RDI;
  
  ser_context::ser_context(in_RDI);
  in_RDI->_vptr_ser_context = (_func_int **)&PTR__jsonpath_evaluator_0133c9b8;
  std::allocator<char>::allocator((allocator *)(in_RDI + 1));
  in_RDI[2]._vptr_ser_context = (_func_int **)0x1;
  in_RDI[3]._vptr_ser_context = (_func_int **)0x1;
  in_RDI[4]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[5]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[6]._vptr_ser_context = (_func_int **)0x0;
  std::
  vector<std::vector<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::allocator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::allocator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*>_>_>_>
  ::vector((vector<std::vector<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::allocator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::allocator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*>_>_>_>
            *)0x561cf1);
  std::
  vector<jsoncons::jsonpath::detail::path_state,_std::allocator<jsoncons::jsonpath::detail::path_state>_>
  ::vector((vector<jsoncons::jsonpath::detail::path_state,_std::allocator<jsoncons::jsonpath::detail::path_state>_>
            *)0x561cfe);
  std::
  vector<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ::vector((vector<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
            *)0x561d0b);
  std::
  vector<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ::vector((vector<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
            *)0x561d1b);
  return;
}

Assistant:

jsonpath_evaluator(const allocator_type& alloc = allocator_type())
            : alloc_(alloc)
        {
        }